

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_transform_feedback2(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_transform_feedback2 != 0) {
    glad_glBindTransformFeedbackNV =
         (PFNGLBINDTRANSFORMFEEDBACKNVPROC)(*load)("glBindTransformFeedbackNV");
    glad_glDeleteTransformFeedbacksNV =
         (PFNGLDELETETRANSFORMFEEDBACKSNVPROC)(*load)("glDeleteTransformFeedbacksNV");
    glad_glGenTransformFeedbacksNV =
         (PFNGLGENTRANSFORMFEEDBACKSNVPROC)(*load)("glGenTransformFeedbacksNV");
    glad_glIsTransformFeedbackNV =
         (PFNGLISTRANSFORMFEEDBACKNVPROC)(*load)("glIsTransformFeedbackNV");
    glad_glPauseTransformFeedbackNV =
         (PFNGLPAUSETRANSFORMFEEDBACKNVPROC)(*load)("glPauseTransformFeedbackNV");
    glad_glResumeTransformFeedbackNV =
         (PFNGLRESUMETRANSFORMFEEDBACKNVPROC)(*load)("glResumeTransformFeedbackNV");
    glad_glDrawTransformFeedbackNV =
         (PFNGLDRAWTRANSFORMFEEDBACKNVPROC)(*load)("glDrawTransformFeedbackNV");
  }
  return;
}

Assistant:

static void load_GL_NV_transform_feedback2(GLADloadproc load) {
	if(!GLAD_GL_NV_transform_feedback2) return;
	glad_glBindTransformFeedbackNV = (PFNGLBINDTRANSFORMFEEDBACKNVPROC)load("glBindTransformFeedbackNV");
	glad_glDeleteTransformFeedbacksNV = (PFNGLDELETETRANSFORMFEEDBACKSNVPROC)load("glDeleteTransformFeedbacksNV");
	glad_glGenTransformFeedbacksNV = (PFNGLGENTRANSFORMFEEDBACKSNVPROC)load("glGenTransformFeedbacksNV");
	glad_glIsTransformFeedbackNV = (PFNGLISTRANSFORMFEEDBACKNVPROC)load("glIsTransformFeedbackNV");
	glad_glPauseTransformFeedbackNV = (PFNGLPAUSETRANSFORMFEEDBACKNVPROC)load("glPauseTransformFeedbackNV");
	glad_glResumeTransformFeedbackNV = (PFNGLRESUMETRANSFORMFEEDBACKNVPROC)load("glResumeTransformFeedbackNV");
	glad_glDrawTransformFeedbackNV = (PFNGLDRAWTRANSFORMFEEDBACKNVPROC)load("glDrawTransformFeedbackNV");
}